

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::
BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::LogicalExprReader>
::BinaryArgReader(BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::LogicalExprReader>
                  *this,NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *r)

{
  NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *in_RDI;
  LogicalExprReader *in_stack_ffffffffffffffd8;
  
  NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::LogicalExprReader::Read_abi_cxx11_
            (in_stack_ffffffffffffffd8,in_RDI);
  NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::LogicalExprReader::Read_abi_cxx11_
            (in_stack_ffffffffffffffd8,in_RDI);
  return;
}

Assistant:

BinaryArgReader(NLReader &r)
      : lhs(ExprReader().Read(r)), rhs(ExprReader().Read(r)) {}